

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_write_request.cc
# Opt level: O2

void __thiscall
NarpcWriteRequest::NarpcWriteRequest
          (NarpcWriteRequest *this,int key,longlong address,shared_ptr<crail::ByteBuffer> *payload)

{
  element_type *peVar1;
  
  NarpcStorageRequest::NarpcStorageRequest(&this->super_NarpcStorageRequest,2);
  (this->super_NarpcStorageRequest).super_RpcMessage._vptr_RpcMessage =
       (_func_int **)&PTR_Update_0013c788;
  *(int *)&(this->super_NarpcStorageRequest).field_0xc = key;
  this->address_ = address;
  peVar1 = (payload->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->length_ = peVar1->limit_ - peVar1->position_;
  std::__shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->payload_).super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>,
             &payload->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

NarpcWriteRequest::NarpcWriteRequest(int key, long long address,
                                     shared_ptr<ByteBuffer> payload)
    : NarpcStorageRequest(static_cast<int>(NarpcStorageRequestType::Write)),
      key_(key), address_(address), length_(payload->remaining()),
      payload_(payload) {}